

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

void QtPrivate::q_relocate_overlap_n_left_move<std::reverse_iterator<QHolder*>,long_long>
               (reverse_iterator<QHolder_*> *first,longlong n,reverse_iterator<QHolder_*> *d_first)

{
  bool bVar1;
  reverse_iterator<QHolder_*> *in_RDX;
  reverse_iterator<QHolder_*> *in_RDI;
  long in_FS_OFFSET;
  reverse_iterator<QHolder_*> overlapEnd;
  reverse_iterator<QHolder_*> overlapBegin;
  pair<const_std::reverse_iterator<QHolder_*>_&,_const_std::reverse_iterator<QHolder_*>_&> pair;
  reverse_iterator<QHolder_*> d_last;
  Destructor destroyer;
  reference in_stack_ffffffffffffff78;
  reference in_stack_ffffffffffffff80;
  reverse_iterator<QHolder_*> *this;
  reverse_iterator<QHolder_*> local_48;
  reverse_iterator<QHolder_*> local_40;
  pair<const_std::reverse_iterator<QHolder_*>_&,_const_std::reverse_iterator<QHolder_*>_&> local_38;
  undefined8 local_28;
  Destructor local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.iter = (reverse_iterator<QHolder_*> *)0xaaaaaaaaaaaaaaaa;
  local_20.end.current = (QHolder *)0xaaaaaaaaaaaaaaaa;
  local_20.intermediate.current = (QHolder *)0xaaaaaaaaaaaaaaaa;
  this = in_RDX;
  q_relocate_overlap_n_left_move<std::reverse_iterator<QHolder*>,long_long>(std::
  reverse_iterator<QHolder*>,long_long,std::reverse_iterator<QHolder*>)::Destructor::Destructor(std
  ::reverse_iterator<QHolder*>__
            ((Destructor *)in_stack_ffffffffffffff80,
             (reverse_iterator<QHolder_*> *)in_stack_ffffffffffffff78);
  local_28 = 0xaaaaaaaaaaaaaaaa;
  std::reverse_iterator<QHolder_*>::operator+(this,(difference_type)in_stack_ffffffffffffff80);
  local_38.second = (reverse_iterator<QHolder_*> *)0xaaaaaaaaaaaaaaaa;
  local_38.first = (reverse_iterator<QHolder_*> *)0xaaaaaaaaaaaaaaaa;
  local_38 = std::minmax<std::reverse_iterator<QHolder*>>
                       (this,(reverse_iterator<QHolder_*> *)in_stack_ffffffffffffff80);
  local_40.current = (QHolder *)0xaaaaaaaaaaaaaaaa;
  std::reverse_iterator<QHolder_*>::reverse_iterator(&local_40,local_38.first);
  local_48.current = (QHolder *)0xaaaaaaaaaaaaaaaa;
  std::reverse_iterator<QHolder_*>::reverse_iterator(&local_48,local_38.second);
  while( true ) {
    bVar1 = std::operator!=((reverse_iterator<QHolder_*> *)in_stack_ffffffffffffff80,
                            (reverse_iterator<QHolder_*> *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    in_stack_ffffffffffffff80 = std::reverse_iterator<QHolder_*>::operator*(in_RDX);
    std::reverse_iterator<QHolder_*>::operator*(in_RDI);
    QHolder::QHolder(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::reverse_iterator<QHolder_*>::operator++(in_RDX);
    std::reverse_iterator<QHolder_*>::operator++(in_RDI);
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QHolder_*>,_long_long>::Destructor::freeze
            (&local_20);
  while( true ) {
    bVar1 = std::operator!=((reverse_iterator<QHolder_*> *)in_stack_ffffffffffffff80,
                            (reverse_iterator<QHolder_*> *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    in_stack_ffffffffffffff78 = std::reverse_iterator<QHolder_*>::operator*(in_RDI);
    std::reverse_iterator<QHolder_*>::operator*(in_RDX);
    QHolder::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::reverse_iterator<QHolder_*>::operator++(in_RDX);
    std::reverse_iterator<QHolder_*>::operator++(in_RDI);
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QHolder_*>,_long_long>::Destructor::commit
            (&local_20);
  while( true ) {
    bVar1 = std::operator!=((reverse_iterator<QHolder_*> *)in_stack_ffffffffffffff80,
                            (reverse_iterator<QHolder_*> *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    std::reverse_iterator<QHolder_*>::operator--(in_RDI);
    std::reverse_iterator<QHolder_*>::operator->
              ((reverse_iterator<QHolder_*> *)in_stack_ffffffffffffff80);
    QHolder::~QHolder((QHolder *)0x14bd1a);
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QHolder_*>,_long_long>::Destructor::
  ~Destructor((Destructor *)in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}